

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub.c
# Opt level: O2

void Gia_ManSortUnatesInt
               (word *pOff,word *pOn,Vec_Ptr_t *vDivs,int nWords,Vec_Int_t *vUnateLits,
               Vec_Int_t *vUnateLitsW,Vec_Wec_t *vSorter)

{
  int iVar1;
  int iVar2;
  word *x;
  Vec_Int_t *p;
  int iVar3;
  
  Vec_WecInit(vSorter,nWords << 6);
  for (iVar3 = 0; iVar3 < vUnateLits->nSize; iVar3 = iVar3 + 1) {
    iVar1 = Vec_IntEntry(vUnateLits,iVar3);
    iVar2 = Abc_Lit2Var(iVar1);
    x = (word *)Vec_PtrEntry(vDivs,iVar2);
    iVar2 = Abc_LitIsCompl(iVar1);
    iVar2 = Abc_TtCountOnesVecMask(x,pOn,nWords,iVar2);
    Vec_WecPush(vSorter,iVar2,iVar1);
  }
  vUnateLits->nSize = 0;
  vUnateLitsW->nSize = 0;
  iVar3 = vSorter->nSize;
  while (0 < iVar3) {
    iVar3 = iVar3 + -1;
    p = Vec_WecEntry(vSorter,iVar3);
    for (iVar1 = 0; iVar1 < p->nSize; iVar1 = iVar1 + 1) {
      iVar2 = Vec_IntEntry(p,iVar1);
      Vec_IntPush(vUnateLits,iVar2);
      Vec_IntPush(vUnateLitsW,iVar3);
    }
  }
  Vec_WecClear(vSorter);
  return;
}

Assistant:

void Gia_ManSortUnatesInt( word * pOff, word * pOn, Vec_Ptr_t * vDivs, int nWords, Vec_Int_t * vUnateLits, Vec_Int_t * vUnateLitsW, Vec_Wec_t * vSorter )
{
    int i, k, iLit;
    Vec_Int_t * vLevel;
    Vec_WecInit( vSorter, nWords*64 );
    Vec_IntForEachEntry( vUnateLits, iLit, i )
    {
        word * pDiv = (word *)Vec_PtrEntry(vDivs, Abc_Lit2Var(iLit));
        //assert( !Abc_TtIntersectOne( pOff, 0, pDiv, Abc_LitIsCompl(iLit), nWords ) );
        Vec_WecPush( vSorter, Abc_TtCountOnesVecMask(pDiv, pOn, nWords, Abc_LitIsCompl(iLit)), iLit );
    }
    Vec_IntClear( vUnateLits );
    Vec_IntClear( vUnateLitsW );
    Vec_WecForEachLevelReverse( vSorter, vLevel, k )
        Vec_IntForEachEntry( vLevel, iLit, i )
        {
            Vec_IntPush( vUnateLits, iLit );
            Vec_IntPush( vUnateLitsW, k );
        }
    //Vec_IntPrint( Vec_WecEntry(vSorter, 0) );
    Vec_WecClear( vSorter );
}